

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O1

void __thiscall OpenMD::SC::initialize(SC *this)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  pointer pSVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  value_type_conflict1 local_2c;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->SCtypes)._M_t);
  piVar2 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  pSVar3 = (this->SCdata).
           super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->SCdata).super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    (this->SCdata).super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar3;
  }
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::_M_erase_at_end(&this->MixingMap,
                    (this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->nSC_ = 0;
  local_2c = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->SCtids,
             (this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
             _M_node_count,&local_2c);
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var5 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    bVar4 = AtomType::isSC(*(AtomType **)(p_Var5 + 1));
    if (bVar4) {
      this->nSC_ = this->nSC_ + 1;
    }
  }
  std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::resize
            (&this->SCdata,(long)this->nSC_);
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)this->nSC_);
  for (p_Var5 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    bVar4 = AtomType::isSC(*(AtomType **)(p_Var5 + 1));
    if (bVar4) {
      addType(this,*(AtomType **)(p_Var5 + 1));
    }
  }
  this->initialized_ = true;
  return;
}

Assistant:

void SC::initialize() {
    // find all of the SC atom Types:
    SCtypes.clear();
    SCtids.clear();
    SCdata.clear();
    MixingMap.clear();
    nSC_ = 0;

    SCtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSC()) nSC_++;
    }
    SCdata.resize(nSC_);
    MixingMap.resize(nSC_);
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSC()) addType((*at));
    }
    initialized_ = true;
  }